

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O3

Result __thiscall wabt::TypeChecker::CheckOpcode3(TypeChecker *this,Opcode opcode)

{
  Result RVar1;
  Opcode local_64;
  char *local_60;
  Type local_50;
  Type local_4c;
  Type local_48;
  Type local_44;
  
  local_64.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_64);
  Opcode::GetInfo(&local_64);
  Opcode::GetInfo(&local_64);
  Opcode::GetInfo(&local_64);
  RVar1 = PopAndCheck3Types(this,local_4c,local_48,local_44,local_60);
  Opcode::GetInfo(&local_64);
  PushType(this,local_50);
  return (Result)RVar1.enum_;
}

Assistant:

Result TypeChecker::CheckOpcode3(Opcode opcode) {
  Result result =
      PopAndCheck3Types(opcode.GetParamType1(), opcode.GetParamType2(),
                        opcode.GetParamType3(), opcode.GetName());
  PushType(opcode.GetResultType());
  return result;
}